

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

bool __thiscall
deqp::sl::ShaderCase::checkPixels
          (ShaderCase *this,Surface *surface,int minX,int maxX,int minY,int maxY)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *pMVar2;
  byte local_366;
  byte local_365;
  bool local_364;
  byte local_363;
  bool local_362;
  bool local_361;
  MessageBuilder local_360;
  MessageBuilder local_1d0;
  undefined1 local_4a;
  bool local_49;
  RGBA local_48;
  bool isBlack;
  int iStack_44;
  bool isWhite;
  RGBA pixel;
  int x;
  int y;
  bool anyUnexpected;
  bool allBlack;
  bool allWhite;
  TestLog *log;
  int maxY_local;
  int minY_local;
  int maxX_local;
  int minX_local;
  Surface *surface_local;
  ShaderCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  x._3_1_ = 1;
  x._2_1_ = true;
  x._1_1_ = 0;
  for (pixel.m_value = minY; iVar1 = minX, (int)pixel.m_value <= maxY;
      pixel.m_value = pixel.m_value + 1) {
    while (iStack_44 = iVar1, iStack_44 <= maxX) {
      local_48 = tcu::Surface::getPixel(surface,iStack_44,pixel.m_value);
      iVar1 = tcu::RGBA::getRed(&local_48);
      local_361 = false;
      if (iVar1 == 0xff) {
        iVar1 = tcu::RGBA::getGreen(&local_48);
        local_361 = false;
        if (iVar1 == 0xff) {
          iVar1 = tcu::RGBA::getBlue(&local_48);
          local_361 = iVar1 == 0xff;
        }
      }
      local_49 = local_361;
      iVar1 = tcu::RGBA::getRed(&local_48);
      local_362 = false;
      if (iVar1 == 0) {
        iVar1 = tcu::RGBA::getGreen(&local_48);
        local_362 = false;
        if (iVar1 == 0) {
          iVar1 = tcu::RGBA::getBlue(&local_48);
          local_362 = iVar1 == 0;
        }
      }
      local_4a = local_362;
      local_363 = 0;
      if (x._3_1_ != 0) {
        local_363 = local_49;
      }
      x._3_1_ = local_363 & 1;
      local_364 = false;
      if (x._2_1_ != false) {
        local_364 = local_362;
      }
      x._2_1_ = local_364;
      local_365 = 1;
      if (x._1_1_ == 0) {
        local_366 = 0;
        if ((local_49 & 1U) == 0) {
          local_366 = local_362 ^ 0xff;
        }
        local_365 = local_366;
      }
      x._1_1_ = local_365 & 1;
      iVar1 = iStack_44 + 1;
    }
  }
  if (x._3_1_ == 0) {
    if (x._1_1_ == 0) {
      if (x._2_1_ == false) {
        tcu::TestLog::operator<<(&local_360,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar2 = tcu::MessageBuilder::operator<<
                           (&local_360,
                            (char (*) [92])
                            "WARNING: got inconsistent results over the image, when all pixels should be the same color!"
                           );
        tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_360);
      }
    }
    else {
      tcu::TestLog::operator<<(&local_1d0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar2 = tcu::MessageBuilder::operator<<
                         (&local_1d0,
                          (char (*) [91])
                          "WARNING: expecting all rendered pixels to be white or black, but got other colors as well!"
                         );
      tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    }
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ShaderCase::checkPixels(Surface& surface, int minX, int maxX, int minY, int maxY)
{
	TestLog& log		   = m_testCtx.getLog();
	bool	 allWhite	  = true;
	bool	 allBlack	  = true;
	bool	 anyUnexpected = false;

	DE_ASSERT((maxX > minX) && (maxY > minY));

	for (int y = minY; y <= maxY; y++)
	{
		for (int x = minX; x <= maxX; x++)
		{
			RGBA pixel = surface.getPixel(x, y);
			// Note: we really do not want to involve alpha in the check comparison
			// \todo [2010-09-22 kalle] Do we know that alpha would be one? If yes, could use color constants white and black.
			bool isWhite = (pixel.getRed() == 255) && (pixel.getGreen() == 255) && (pixel.getBlue() == 255);
			bool isBlack = (pixel.getRed() == 0) && (pixel.getGreen() == 0) && (pixel.getBlue() == 0);

			allWhite	  = allWhite && isWhite;
			allBlack	  = allBlack && isBlack;
			anyUnexpected = anyUnexpected || (!isWhite && !isBlack);
		}
	}

	if (!allWhite)
	{
		if (anyUnexpected)
			log << TestLog::Message
				<< "WARNING: expecting all rendered pixels to be white or black, but got other colors as well!"
				<< TestLog::EndMessage;
		else if (!allBlack)
			log << TestLog::Message
				<< "WARNING: got inconsistent results over the image, when all pixels should be the same color!"
				<< TestLog::EndMessage;

		return false;
	}
	return true;
}